

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit_editor.cpp
# Opt level: O0

void __thiscall lsim::gui::CircuitEditor::draw_ui(CircuitEditor *this,UIContext *ui_context)

{
  unsigned_long uVar1;
  SimCircuit *pSVar2;
  Point PVar3;
  Transform transform;
  Transform transform_00;
  ulong uVar4;
  ImDrawList *pIVar5;
  bool bVar6;
  Value VVar7;
  node_t node_id_00;
  reference this_00;
  pointer pCVar8;
  char *pcVar9;
  ComponentIcon *pCVar10;
  endpoint_map_t *this_01;
  reference pvVar11;
  mapped_type *pmVar12;
  wire_lut_t *this_02;
  reference pvVar13;
  pointer this_03;
  pin_id_t pVar14;
  Point PVar15;
  Point *pPVar16;
  ModelWireSegment *segment;
  size_t sVar17;
  reference pvVar18;
  Point *delta;
  float fVar19;
  Value local_344;
  ImVec2 local_2b8;
  ImVec2 local_2b0;
  Point local_2a8;
  Point p1_1;
  Point *anchor;
  iterator __end3_1;
  iterator __begin3_1;
  point_container_t *__range3_1;
  Point p0_1;
  ImVec2 local_270;
  Point local_268;
  ImVec2 local_260;
  Point local_258;
  ImVec2 local_250;
  Point local_248;
  ImVec2 local_240;
  ulong local_238;
  size_t idx_1;
  ImVec2 local_224;
  Value local_21c;
  ImU32 segment_color;
  ImVec2 local_210;
  Point local_208;
  Point p1;
  Point p0;
  size_t idx;
  node_t node_id;
  Value value;
  bool dirty_node;
  ImU32 wire_color;
  pointer wire;
  value_type *wire_it;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  wire_lut_t *__range2_1;
  ImVec2 local_1ac;
  ImU32 local_1a4;
  Point PStack_1a0;
  ImU32 pin_color;
  Point endpoint_circuit;
  Point endpoint_screen;
  value_type *pair;
  const_iterator __end3;
  const_iterator __begin3;
  endpoint_map_t *__range3;
  Point local_168;
  Point local_160;
  Point local_158;
  Point PStack_150;
  Point local_148;
  ImVec2 local_134;
  ImVec2 local_12c;
  ImVec2 local_124;
  ImVec2 local_11c;
  ImU32 local_114;
  Point PStack_110;
  ImU32 border_color;
  ImVec2 local_108;
  ImVec2 local_100;
  Point local_f8;
  Point local_f0;
  Point local_e8;
  ImVec2 local_e0;
  Point local_d8;
  Point widget_aabb_max;
  Point widget_aabb_min;
  Transform widget_to_screen;
  unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_> *widget;
  iterator __end2;
  iterator __begin2;
  widget_container_t *__range2;
  Point local_88;
  ImVec2 local_80;
  Point local_78;
  Point local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  Point local_50;
  ImVec2 local_48;
  Point local_40;
  Point local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  ImDrawList *local_20;
  ImDrawList *draw_list;
  UIContext *ui_context_local;
  CircuitEditor *this_local;
  
  draw_list = (ImDrawList *)ui_context;
  ui_context_local = (UIContext *)this;
  local_20 = ImGui::GetWindowDrawList();
  local_28 = ImGui::GetCursorScreenPos();
  local_48 = ImGui::GetCursorScreenPos();
  local_40 = ImVec2::operator_cast_to_Point(&local_48);
  local_58 = ImGui::GetContentRegionMax();
  local_50 = ImVec2::operator_cast_to_Point(&local_58);
  local_38 = Point::operator+(&local_40,&local_50);
  ImVec2::ImVec2(&local_30,&local_38);
  ImGui::PushClipRect(&local_28,&local_30,true);
  pIVar5 = local_20;
  local_60 = ImGui::GetCursorScreenPos();
  local_80 = ImGui::GetCursorScreenPos();
  local_78 = ImVec2::operator_cast_to_Point(&local_80);
  __range2 = (widget_container_t *)ImGui::GetContentRegionMax();
  local_88 = ImVec2::operator_cast_to_Point((ImVec2 *)&__range2);
  local_70 = Point::operator+(&local_78,&local_88);
  ImVec2::ImVec2(&local_68,&local_70);
  ImDrawList::PushClipRect(pIVar5,local_60,local_68,true);
  bVar6 = is_simulating(this);
  if (!bVar6) {
    draw_grid(this,local_20);
  }
  ui_popup_embed_circuit(this);
  ui_popup_sub_circuit(this,(UIContext *)draw_list);
  ui_popup_edit_segment(this);
  ImDrawList::ChannelsSplit(local_20,2);
  __end2 = std::
           vector<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>,_std::allocator<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>_>_>
           ::begin(&this->m_widgets);
  widget = (unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
            *)std::
              vector<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>,_std::allocator<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>_>_>
              ::end(&this->m_widgets);
  while (bVar6 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>_*,_std::vector<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>,_std::allocator<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>_>_>_>
                                     *)&widget), bVar6) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>_*,_std::vector<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>,_std::allocator<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>_>_>_>
              ::operator*(&__end2);
    ImGui::PushID(this_00);
    pCVar8 = std::
             unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
             ::operator->(this_00);
    pPVar16 = (Point *)ComponentWidget::to_circuit(pCVar8);
    PVar15 = pPVar16[2];
    widget_aabb_min = *pPVar16;
    PVar3 = pPVar16[1];
    delta = &this->m_screen_offset;
    Transform::translate((Transform *)&widget_aabb_min,delta);
    pCVar8 = std::
             unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
             ::operator->(this_00);
    pPVar16 = ComponentWidget::aabb_min(pCVar8);
    widget_aabb_max = Point::operator+(pPVar16,delta);
    pCVar8 = std::
             unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
             ::operator->(this_00);
    pPVar16 = ComponentWidget::aabb_max(pCVar8);
    local_d8 = Point::operator+(pPVar16,delta);
    pCVar8 = std::
             unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
             ::operator->(this_00);
    bVar6 = ComponentWidget::has_draw_callback(pCVar8);
    if (bVar6) {
      ImVec2::ImVec2(&local_e0,&widget_aabb_max);
      ImGui::SetCursorScreenPos(&local_e0);
      ImDrawList::ChannelsSetCurrent(local_20,1);
      pCVar8 = std::
               unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
               ::operator->(this_00);
      local_f8 = widget_aabb_min;
      transform.m_el[1][0] = PVar3.x;
      transform.m_el[1][1] = PVar3.y;
      transform.m_el[0][0] = widget_aabb_min.x;
      transform.m_el[0][1] = widget_aabb_min.y;
      transform.m_el[2][0] = PVar15.x;
      transform.m_el[2][1] = PVar15.y;
      local_f0 = PVar3;
      local_e8 = PVar15;
      ComponentWidget::run_draw_callback(pCVar8,this,transform);
    }
    ImDrawList::ChannelsSetCurrent(local_20,0);
    ImVec2::ImVec2(&local_100,&widget_aabb_max);
    ImGui::SetCursorScreenPos(&local_100);
    pCVar8 = std::
             unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
             ::operator->(this_00);
    PStack_110 = ComponentWidget::aabb_size(pCVar8);
    ImVec2::ImVec2(&local_108,&stack0xfffffffffffffef0);
    ImGui::InvisibleButton("widget",&local_108);
    pCVar8 = std::
             unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
             ::operator->(this_00);
    bVar6 = ComponentWidget::has_tooltip(pCVar8);
    if ((bVar6) && (bVar6 = ImGui::IsItemHovered(0), bVar6)) {
      pCVar8 = std::
               unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
               ::operator->(this_00);
      pcVar9 = ComponentWidget::tooltip(pCVar8);
      ImGui::SetTooltip("%s",pcVar9);
    }
    local_114 = 0xffc8c8c8;
    pCVar8 = std::
             unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
             ::get(this_00);
    bVar6 = is_selected(this,pCVar8);
    pIVar5 = local_20;
    if (bVar6) {
      ImVec2::ImVec2(&local_11c,&widget_aabb_max);
      ImVec2::ImVec2(&local_124,&local_d8);
      ImDrawList::AddRectFilled(pIVar5,&local_11c,&local_124,0xff006464,0.0,0xf);
      if (this->m_state == CS_DRAGGING) {
        local_114 = 0xff646464;
      }
    }
    pCVar8 = std::
             unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
             ::operator->(this_00);
    bVar6 = ComponentWidget::has_border(pCVar8);
    pIVar5 = local_20;
    if (bVar6) {
      ImVec2::ImVec2(&local_12c,&widget_aabb_max);
      ImVec2::ImVec2(&local_134,&local_d8);
      ImDrawList::AddRect(pIVar5,&local_12c,&local_134,local_114,0.0,0xf,1.0);
    }
    pCVar8 = std::
             unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
             ::operator->(this_00);
    bVar6 = ComponentWidget::has_border(pCVar8);
    if (bVar6) {
      pCVar8 = std::
               unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
               ::operator->(this_00);
      pCVar10 = ComponentWidget::icon(pCVar8);
      if (pCVar10 != (ComponentIcon *)0x0) {
        pCVar8 = std::
                 unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                 ::operator->(this_00);
        pCVar10 = ComponentWidget::icon(pCVar8);
        local_158 = widget_aabb_min;
        PStack_150 = PVar3;
        local_148 = PVar15;
        pCVar8 = std::
                 unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                 ::operator->(this_00);
        local_168 = ComponentWidget::aabb_size(pCVar8);
        Point::Point((Point *)&__range3,10.0,10.0);
        local_160 = Point::operator-(&local_168,(Point *)&__range3);
        transform_00.m_el[1][0] = PStack_150.x;
        transform_00.m_el[1][1] = PStack_150.y;
        transform_00.m_el[0][0] = local_158.x;
        transform_00.m_el[0][1] = local_158.y;
        transform_00.m_el[2][0] = local_148.x;
        transform_00.m_el[2][1] = local_148.y;
        ComponentIcon::draw(pCVar10,transform_00,local_160,local_20,2,0xffc8c8c8);
      }
    }
    bVar6 = ImGui::IsItemHovered(0);
    if (bVar6) {
      pCVar8 = std::
               unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
               ::get(this_00);
      this->m_hovered_widget = pCVar8;
    }
    pCVar8 = std::
             unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
             ::operator->(this_00);
    this_01 = ComponentWidget::endpoints(pCVar8);
    __end3 = std::
             unordered_map<unsigned_long,_lsim::Point,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_lsim::Point>_>_>
             ::begin(this_01);
    pair = (value_type *)
           std::
           unordered_map<unsigned_long,_lsim::Point,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_lsim::Point>_>_>
           ::end(this_01);
    while (bVar6 = std::__detail::operator!=
                             (&__end3.
                               super__Node_iterator_base<std::pair<const_unsigned_long,_lsim::Point>,_false>
                              ,(_Node_iterator_base<std::pair<const_unsigned_long,_lsim::Point>,_false>
                                *)&pair), bVar6) {
      pvVar11 = std::__detail::
                _Node_const_iterator<std::pair<const_unsigned_long,_lsim::Point>,_false,_false>::
                operator*(&__end3);
      endpoint_circuit = Transform::apply((Transform *)&widget_aabb_min,&pvVar11->second);
      PStack_1a0 = Point::operator-(&endpoint_circuit,&this->m_screen_offset);
      local_1a4 = 0xff969696;
      bVar6 = is_simulating(this);
      if (bVar6) {
        VVar7 = SimCircuit::pin_output(this->m_sim_circuit,pvVar11->first);
        local_1a4 = COLOR_CONNECTION[VVar7];
      }
      uVar1 = pvVar11->first;
      pmVar12 = std::
                unordered_map<lsim::Point,_unsigned_long,_lsim::gui::CircuitEditor::PointHash,_std::equal_to<lsim::Point>,_std::allocator<std::pair<const_lsim::Point,_unsigned_long>_>_>
                ::operator[](&this->m_point_pin_lut,&stack0xfffffffffffffe60);
      pIVar5 = local_20;
      *pmVar12 = uVar1;
      ImVec2::ImVec2(&local_1ac,&endpoint_circuit);
      ImDrawList::AddCircleFilled(pIVar5,&local_1ac,3.0,local_1a4,0xc);
      fVar19 = distance_squared(&this->m_mouse_grid_point,&stack0xfffffffffffffe60);
      pIVar5 = local_20;
      if (fVar19 <= 2.0) {
        ImVec2::ImVec2((ImVec2 *)((long)&__range2_1 + 4),&endpoint_circuit);
        ImDrawList::AddCircle(pIVar5,(ImVec2 *)((long)&__range2_1 + 4),8.0,0xc800ffff,0xc,2.0);
        this->m_hovered_pin = pvVar11->first;
      }
      std::__detail::_Node_const_iterator<std::pair<const_unsigned_long,_lsim::Point>,_false,_false>
      ::operator++(&__end3);
    }
    ImGui::PopID();
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>_*,_std::vector<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>,_std::allocator<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>_>_>_>
    ::operator++(&__end2);
  }
  this_02 = ModelCircuit::wires(this->m_model_circuit);
  __end2_1 = std::
             unordered_map<unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>_>_>
             ::begin(this_02);
  wire_it = (value_type *)
            std::
            unordered_map<unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>_>_>
            ::end(this_02);
  while (bVar6 = std::__detail::operator!=
                           (&__end2_1.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>,_false>
                            ,(_Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>,_false>
                              *)&wire_it), bVar6) {
    pvVar13 = std::__detail::
              _Node_const_iterator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>,_false,_false>
              ::operator*(&__end2_1);
    this_03 = std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>::get
                        (&pvVar13->second);
    value = 0xff787878;
    node_id._3_1_ = false;
    bVar6 = is_simulating(this);
    if ((bVar6) && (sVar17 = ModelWire::num_pins(this_03), sVar17 != 0)) {
      pSVar2 = this->m_sim_circuit;
      pVar14 = ModelWire::pin(this_03,0);
      VVar7 = SimCircuit::read_pin(pSVar2,pVar14);
      value = COLOR_CONNECTION[VVar7];
      pSVar2 = this->m_sim_circuit;
      pVar14 = ModelWire::pin(this_03,0);
      node_id_00 = SimCircuit::pin_node(pSVar2,pVar14);
      node_id._3_1_ = SimCircuit::node_dirty(this->m_sim_circuit,node_id_00);
    }
    p0.x = 0.0;
    p0.y = 0.0;
    for (; PVar15 = (Point)ModelWire::num_segments(this_03), (ulong)p0 < (ulong)PVar15;
        p0 = (Point)((long)p0 + 1)) {
      pPVar16 = ModelWire::segment_point(this_03,(size_t)p0,0);
      p1 = Point::operator+(pPVar16,&this->m_screen_offset);
      pPVar16 = ModelWire::segment_point(this_03,(size_t)p0,1);
      local_208 = Point::operator+(pPVar16,&this->m_screen_offset);
      pIVar5 = local_20;
      if (node_id._3_1_ != false) {
        ImVec2::ImVec2(&local_210,&p1);
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffde8,&local_208);
        ImDrawList::AddLine(pIVar5,&local_210,(ImVec2 *)&stack0xfffffffffffffde8,0xaf969696,4.0);
      }
      segment = ModelWire::segment_by_index(this_03,(size_t)p0);
      bVar6 = is_selected(this,segment);
      pIVar5 = local_20;
      if (bVar6) {
        local_344 = 0xff006464;
      }
      else {
        local_344 = value;
      }
      local_21c = local_344;
      ImVec2::ImVec2(&local_224,&p1);
      ImVec2::ImVec2((ImVec2 *)((long)&idx_1 + 4),&local_208);
      ImDrawList::AddLine(pIVar5,&local_224,(ImVec2 *)((long)&idx_1 + 4),local_21c,2.0);
    }
    for (local_238 = 0; uVar4 = local_238, sVar17 = ModelWire::num_junctions(this_03),
        uVar4 < sVar17; local_238 = local_238 + 1) {
      sVar17 = ModelWire::junction_segment_count(this_03,local_238);
      pIVar5 = local_20;
      if (2 < sVar17) {
        pPVar16 = ModelWire::junction_position(this_03,local_238);
        local_248 = Point::operator+(pPVar16,&this->m_screen_offset);
        ImVec2::ImVec2(&local_240,&local_248);
        ImDrawList::AddCircleFilled(pIVar5,&local_240,4.0,value,0xc);
      }
    }
    if ((this->m_hovered_wire == (ModelWire *)0x0) &&
       (bVar6 = ModelWire::point_on_wire(this_03,&this->m_mouse_grid_point), pIVar5 = local_20,
       bVar6)) {
      local_258 = Point::operator+(&this->m_mouse_grid_point,&this->m_screen_offset);
      ImVec2::ImVec2(&local_250,&local_258);
      ImDrawList::AddCircle(pIVar5,&local_250,8.0,0xc800ffff,0xc,2.0);
      this->m_hovered_wire = this_03;
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>,_false,_false>
    ::operator++(&__end2_1);
  }
  if (this->m_state == CS_AREA_SELECT) {
    local_268 = Point::operator+(&this->m_area_sel_a,&this->m_screen_offset);
    ImVec2::ImVec2(&local_260,&local_268);
    p0_1 = Point::operator+(&this->m_mouse_grid_point,&this->m_screen_offset);
    ImVec2::ImVec2(&local_270,&p0_1);
    ImGuiEx::RectFilled(local_260,local_270,0x80800000);
  }
  if (this->m_state == CS_CREATE_WIRE) {
    pvVar18 = std::vector<lsim::Point,_std::allocator<lsim::Point>_>::back(&this->m_line_anchors);
    fVar19 = (this->m_mouse_grid_point).y;
    pvVar18->x = (this->m_mouse_grid_point).x;
    pvVar18->y = fVar19;
    pvVar18 = std::vector<lsim::Point,_std::allocator<lsim::Point>_>::front(&this->m_line_anchors);
    __range3_1 = (point_container_t *)Point::operator+(pvVar18,&this->m_screen_offset);
    __end3_1 = std::vector<lsim::Point,_std::allocator<lsim::Point>_>::begin(&this->m_line_anchors);
    anchor = (Point *)std::vector<lsim::Point,_std::allocator<lsim::Point>_>::end
                                (&this->m_line_anchors);
    while (bVar6 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<lsim::Point_*,_std::vector<lsim::Point,_std::allocator<lsim::Point>_>_>
                               *)&anchor), bVar6) {
      p1_1 = (Point)__gnu_cxx::
                    __normal_iterator<lsim::Point_*,_std::vector<lsim::Point,_std::allocator<lsim::Point>_>_>
                    ::operator*(&__end3_1);
      local_2a8 = Point::operator+((Point *)p1_1,&this->m_screen_offset);
      pIVar5 = local_20;
      ImVec2::ImVec2(&local_2b0,(Point *)&__range3_1);
      ImVec2::ImVec2(&local_2b8,&local_2a8);
      ImDrawList::AddLine(pIVar5,&local_2b0,&local_2b8,0xffff0000,4.0);
      __range3_1 = (point_container_t *)local_2a8;
      __gnu_cxx::
      __normal_iterator<lsim::Point_*,_std::vector<lsim::Point,_std::allocator<lsim::Point>_>_>::
      operator++(&__end3_1);
    }
  }
  ImDrawList::ChannelsMerge(local_20);
  ImGui::PopClipRect();
  ImDrawList::PopClipRect(local_20);
  return;
}

Assistant:

void CircuitEditor::draw_ui(UIContext *ui_context) {

	auto draw_list = ImGui::GetWindowDrawList();
	
	// clipping
	ImGui::PushClipRect(ImGui::GetCursorScreenPos(), Point(ImGui::GetCursorScreenPos()) + ImGui::GetContentRegionMax(), true);
	draw_list->PushClipRect(ImGui::GetCursorScreenPos(), Point(ImGui::GetCursorScreenPos()) + ImGui::GetContentRegionMax(), true);

	// grid
	if (!is_simulating()) {
		draw_grid(draw_list);
	}

	// potential popup windows
	ui_popup_embed_circuit();
	ui_popup_sub_circuit(ui_context);
	ui_popup_edit_segment();
	
	// create two layers to draw the background and the widgets
	draw_list->ChannelsSplit(2);

	// draw all widgets
	for (auto &widget : m_widgets) {

		ImGui::PushID(&widget);
		
		// setup
		Transform widget_to_screen = widget->to_circuit();
		widget_to_screen.translate(m_screen_offset);

		const auto widget_aabb_min = widget->aabb_min() + m_screen_offset;
		const auto widget_aabb_max = widget->aabb_max() + m_screen_offset;

		// custom draw routine
		if (widget->has_draw_callback()) {
			ImGui::SetCursorScreenPos(widget_aabb_min);
			draw_list->ChannelsSetCurrent(1);
			widget->run_draw_callback(this, widget_to_screen);
		}
	
		// invisible button used for widget selection
		draw_list->ChannelsSetCurrent(0);         // background
		ImGui::SetCursorScreenPos(widget_aabb_min);
		ImGui::InvisibleButton("widget", widget->aabb_size());

		// tooltip
		if (widget->has_tooltip() && ImGui::IsItemHovered()) {
			ImGui::SetTooltip("%s", widget->tooltip());
		}

		// draw border
		auto border_color = COLOR_COMPONENT_BORDER;

		if (is_selected(widget.get())) {
			draw_list->AddRectFilled(widget_aabb_min, widget_aabb_max, COLOR_COMPONENT_SELECTED);
			if (m_state == CS_DRAGGING) {
				border_color = COLOR_COMPONENT_BORDER_DRAGGING;
			}
		}

		if (widget->has_border()) {
  		  	draw_list->AddRect(widget_aabb_min, widget_aabb_max, border_color);
		}

		// draw icon
		if (widget->has_border() && widget->icon() != nullptr) {
    		widget->icon()->draw(widget_to_screen, widget->aabb_size() - Point(10,10), 
							   draw_list, 2, COLOR_COMPONENT_ICON);
		}

		// check for mouse hover
		if (ImGui::IsItemHovered()) {
			m_hovered_widget = widget.get();
		}

		// end points
		for (const auto &pair : widget->endpoints()) {
			// pair.first = pin-id ; pair.second = position
			auto endpoint_screen = widget_to_screen.apply(pair.second);
			auto endpoint_circuit = endpoint_screen - m_screen_offset;

			auto pin_color = COLOR_ENDPOINT;
			if (is_simulating()) {
				pin_color = COLOR_CONNECTION[m_sim_circuit->pin_output(pair.first)];
			}

			m_point_pin_lut[endpoint_circuit] = pair.first;

			draw_list->AddCircleFilled(endpoint_screen, 3, pin_color);

			if (distance_squared(m_mouse_grid_point, endpoint_circuit) <= 2) {
				draw_list->AddCircle(endpoint_screen, 8, COLOR_ENDPOINT_HOVER, 12, 2);
				m_hovered_pin = pair.first;
			}
		}

		ImGui::PopID();
	}

	// draw wires
	for (const auto &wire_it : m_model_circuit->wires()) {
		auto wire = wire_it.second.get();
		auto wire_color = COLOR_CONNECTION_UNDEFINED;
		bool dirty_node = false;

		// check color & highlight when simulation is running
		if (is_simulating() && wire->num_pins() > 0) {
			auto value = m_sim_circuit->read_pin(wire->pin(0));
			wire_color = COLOR_CONNECTION[value];

			auto node_id = m_sim_circuit->pin_node(wire->pin(0));
			dirty_node = m_sim_circuit->node_dirty(node_id);
		}

		// segments
		for (size_t idx = 0; idx < wire->num_segments(); ++idx) {
			const auto p0 = wire->segment_point(idx, 0) + m_screen_offset;
			const auto p1 = wire->segment_point(idx, 1) + m_screen_offset;

			if (dirty_node) {
				draw_list->AddLine(p0, p1, COLOR_CONNECTION_DIRTY, 4.0f);
			}

			auto segment_color = is_selected(wire->segment_by_index(idx)) ? COLOR_WIRE_SELECTED : wire_color;
			draw_list->AddLine(p0, p1, segment_color, 2.0f);
		}

		// draw junctions with more than 2 segments
		for (size_t idx = 0; idx < wire->num_junctions(); ++idx) {
			if (wire->junction_segment_count(idx) > 2) {
				draw_list->AddCircleFilled(wire->junction_position(idx) + m_screen_offset, 4, wire_color);
			}
		}
		
		// check for hovered wire
		if (m_hovered_wire == nullptr && wire->point_on_wire(m_mouse_grid_point)) {
			draw_list->AddCircle(m_mouse_grid_point + m_screen_offset, 8, COLOR_ENDPOINT_HOVER, 12, 2);
			m_hovered_wire = wire;
		}
	} 

	// draw area selection box
	if (m_state == CS_AREA_SELECT) {
		ImGuiEx::RectFilled(m_area_sel_a + m_screen_offset, m_mouse_grid_point + m_screen_offset, 
							IM_COL32(0, 0, 128, 128));
	}

	// draw wire under construction
	if (m_state == CS_CREATE_WIRE) {
		m_line_anchors.back() = m_mouse_grid_point;
		Point p0 = m_line_anchors.front() + m_screen_offset;

		for (const auto &anchor : m_line_anchors) {
			Point p1 = anchor + m_screen_offset;
			draw_list->AddLine(p0, p1, IM_COL32(0, 0, 255, 255), 4);
			p0 = p1;
		}
	}

	draw_list->ChannelsMerge();
	ImGui::PopClipRect();
	draw_list->PopClipRect();
}